

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
memory::
Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
::
Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>&,void>
          (Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
           *this,Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *other)

{
  size_type n;
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_> local_31;
  view_type local_30;
  ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<8UL>_>_>_>
  *local_18;
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *other_local;
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *this_local;
  
  local_18 = &other->super_ArrayView<float,_memory::HostCoordinator<float>_>;
  other_local = (Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *)this;
  n = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
      ::size(&other->super_ArrayView<float,_memory::HostCoordinator<float>_>);
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            (&local_30,&local_31,n);
  ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ArrayViewImpl<memory::ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((ArrayViewImpl<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
              *)this,&local_30);
  ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl(&local_30);
  HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),local_18,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(Other&& other)
        : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(other, *this);
    }